

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

char * cli_concat_args(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  size_t size;
  size_t sVar6;
  
  size = 1;
  for (sVar6 = size; (long)sVar6 < (long)argc; sVar6 = sVar6 + 1) {
    sVar2 = strlen(argv[sVar6]);
    size = size + sVar2 + 1;
  }
  pcVar3 = (char *)xmalloc(size);
  lVar4 = 0;
  for (lVar5 = 1; lVar5 < argc; lVar5 = lVar5 + 1) {
    iVar1 = sprintf(pcVar3 + lVar4,"%s ",argv[lVar5]);
    lVar4 = lVar4 + iVar1;
  }
  (pcVar3 + lVar4)[-1] = '\0';
  return pcVar3;
}

Assistant:

char *cli_concat_args(int argc, const char *argv[])
{
	int i;
	size_t length = 1;
	for (i = 1; i < argc; i++) {
		length += strlen(argv[i]) + 1;
	}
	char *result = (char *)xmalloc(length);

	length = 0;
	for (i = 1; i < argc; i++) {
		length += sprintf(result + length, "%s ", argv[i]);
	}
	result[--length] = '\0';
	return result;
}